

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppGenProfile(Vec_Wrd_t *p,int nBits,int *pCounts)

{
  int iVar1;
  word wVar2;
  int local_30;
  int b;
  int k;
  int i;
  word Ent;
  int *pCounts_local;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  for (b = 0; iVar1 = Vec_WrdSize(p), b < iVar1; b = b + 1) {
    wVar2 = Vec_WrdEntry(p,b);
    for (local_30 = 0; local_30 < nBits; local_30 = local_30 + 1) {
      pCounts[local_30] =
           pCounts[local_30] +
           ((uint)(wVar2 >> ((byte)local_30 & 0x3f)) & 1 ^ (uint)(wVar2 >> ((byte)nBits & 0x3f)) & 1
           );
    }
  }
  return;
}

Assistant:

void Abc_SuppGenProfile( Vec_Wrd_t * p, int nBits, int * pCounts )
{
    word Ent;
    int i, k, b;
    Vec_WrdForEachEntry( p, Ent, i )
        for ( b = ((Ent >> nBits) & 1), k = 0; k < nBits; k++ )
            pCounts[k] += ((Ent >> k) & 1) ^ b;
}